

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

_Bool directory_create(char *path)

{
  __mode_t __mask;
  int iVar1;
  
  __mask = umask(0);
  mkdir(path,0x1fd);
  umask(__mask);
  iVar1 = access(path,0);
  return iVar1 == 0;
}

Assistant:

bool directory_create (const char *path) {
    #ifdef WIN32
    CreateDirectoryA(path, NULL);
    #else
    mode_t saved = umask(0);
    mkdir(path, 0775);
    umask(saved);
    #endif
    
    return file_exists(path);
}